

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall benchmark::anon_unknown_1::TimerManager::StartTimer(TimerManager *this)

{
  bool bVar1;
  WallTime WVar2;
  double dVar3;
  double dVar4;
  ostream *local_68;
  CheckHandler local_40 [3];
  undefined1 local_28 [8];
  MutexLock ml;
  bool last_thread;
  TimerManager *this_local;
  
  ml.ml_._15_1_ = 0;
  MutexLock::MutexLock((MutexLock *)local_28,&this->lock_);
  ml.ml_._15_1_ = Barrier(this,(MutexLock *)local_28);
  if ((bool)ml.ml_._15_1_) {
    bVar1 = (this->running_ & 1U) != 0;
    if (bVar1) {
      internal::CheckHandler::CheckHandler
                (local_40,"!running_",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
                 ,"StartTimer",0x91);
      local_68 = internal::CheckHandler::GetLog(local_40);
    }
    else {
      local_68 = internal::GetNullLogInstance();
    }
    std::operator<<(local_68,"Called StartTimer when timer is already running");
    if (bVar1) {
      internal::CheckHandler::~CheckHandler(local_40);
    }
    this->running_ = true;
    WVar2 = walltime::Now();
    this->start_real_time_ = WVar2;
    dVar3 = MyCPUUsage();
    dVar4 = ChildrenCPUUsage();
    this->start_cpu_time_ = dVar3 + dVar4;
  }
  MutexLock::~MutexLock((MutexLock *)local_28);
  if ((ml.ml_._15_1_ & 1) != 0) {
    std::condition_variable::notify_all();
  }
  return;
}

Assistant:

EXCLUDES(lock_) {
    bool last_thread = false;
    {
      MutexLock ml(lock_);
      last_thread = Barrier(ml);
      if (last_thread) {
        CHECK(!running_) << "Called StartTimer when timer is already running";
        running_ = true;
        start_real_time_ = walltime::Now();
        start_cpu_time_ = MyCPUUsage() + ChildrenCPUUsage();
       }
     }
     if (last_thread) {
       phase_condition_.notify_all();
     }
  }